

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O2

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
mxx::impl::
sample_block_decomp<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,impl *this,long begin,size_type end,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *param_5,comm *param_6)

{
  ulong uVar1;
  ulong uVar2;
  value_type my_splitter;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_splitters;
  allocator_type local_71;
  pair<int,_int> local_70;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_50;
  value_type_conflict2 local_38;
  
  if (begin - (long)this == 0) {
    assert_fail("local_size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                ,0xa1,"sample_block_decomp");
  }
  uVar2 = begin - (long)this >> 3;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_50,end,
             (allocator_type *)&local_68);
  for (uVar1 = 0;
      (long)local_50._M_impl.super__Vector_impl_data._M_finish -
      (long)local_50._M_impl.super__Vector_impl_data._M_start >> 3 != uVar1; uVar1 = uVar1 + 1) {
    this = this + (uVar2 / (end + 1) + (ulong)(uVar1 < uVar2 % (end + 1))) * 8;
    local_50._M_impl.super__Vector_impl_data._M_start[uVar1] = *(pair<int,_int> *)(this + -8);
  }
  bitonic_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
            (local_50._M_impl.super__Vector_impl_data._M_start,
             local_50._M_impl.super__Vector_impl_data._M_finish,param_5);
  local_70 = local_50._M_impl.super__Vector_impl_data._M_finish[-1];
  local_38 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
             (long)*(int *)&(param_5->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_38,&local_71);
  local_68._M_impl.super__Vector_impl_data._M_finish[-1] = 0;
  allgatherv<std::pair<int,int>>
            (__return_storage_ptr__,(mxx *)&local_70,
             (pair<int,_int> *)
             (ulong)(*(int *)((long)&(param_5->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) + 1 <
                    *(int *)&(param_5->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_end_of_storage),(size_t)&local_68,
             param_5,param_6);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_68);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_block_decomp(_Iterator begin, _Iterator end, _Compare comp, size_t s, const mxx::comm& comm) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    size_t local_size = std::distance(begin, end);
    MXX_ASSERT(local_size > 0);

    // 1. samples
    //  - pick `s` samples equally spaced such that `s` samples define `s+1`
    //    subsequences in the sorted order
    std::vector<value_type> local_splitters(s);
    _Iterator pos = begin;
    for (size_t i = 0; i < local_splitters.size(); ++i) {
        size_t bucket_size = local_size / (s+1) + (i < (local_size % (s+1)) ? 1 : 0);
        // pick last element of each bucket
        pos += (bucket_size-1);
        local_splitters[i] = *pos;
        ++pos;
    }

    // sort splitters using parallel bitonic sort
    bitonic_sort(local_splitters.begin(), local_splitters.end(), comp, comm);

    // select the last element on each process but the last
    value_type my_splitter = local_splitters.back();
    // allgather splitters (from all but the last processor)
    std::vector<size_t> recv_sizes(comm.size(), 1);
    recv_sizes.back() = 0;
    std::vector<value_type> result_splitters = mxx::allgatherv(&my_splitter, (comm.rank() + 1 < comm.size()) ? 1 : 0, recv_sizes, comm);

    // return resulting splitters
    return result_splitters;
}